

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xorfilter.h
# Opt level: O0

_Bool xor16_allocate(uint32_t size,xor16_t *filter)

{
  ulong uVar1;
  void *pvVar2;
  long in_RSI;
  uint in_EDI;
  bool bVar3;
  double dVar4;
  size_t capacity;
  
  dVar4 = (double)in_EDI * 1.23 + 32.0;
  uVar1 = (ulong)dVar4;
  uVar1 = (uVar1 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f) / 3;
  pvVar2 = malloc(uVar1 * 6);
  *(void **)(in_RSI + 0x10) = pvVar2;
  bVar3 = *(long *)(in_RSI + 0x10) != 0;
  if (bVar3) {
    *(ulong *)(in_RSI + 8) = (uVar1 * 3) / 3;
  }
  return bVar3;
}

Assistant:

static inline bool xor16_allocate(uint32_t size, xor16_t *filter) {
  size_t capacity = (size_t)(32 + 1.23 * size);
  capacity = capacity / 3 * 3;
  filter->fingerprints = (uint16_t *)malloc(capacity * sizeof(uint16_t));
  if (filter->fingerprints != NULL) {
    filter->blockLength = capacity / 3;
    return true;
  } 
  return false;
}